

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_init_ctracpkm_omac(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  undefined1 *puVar2;
  undefined8 uVar3;
  undefined8 in_RDX;
  uchar *in_RSI;
  uchar *in_RDI;
  uchar cipher_key [32];
  uchar *in_stack_00000020;
  gost_grasshopper_cipher_ctx_ctr *c;
  undefined4 in_stack_00000030;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  iVar4 = (int)((ulong)in_RDX >> 0x20);
  puVar2 = (undefined1 *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  *puVar2 = 6;
  EVP_CIPHER_CTX_set_num(in_RDI,0);
  *(undefined4 *)(puVar2 + 0x1a8) = 0x1000;
  if (in_RSI == (uchar *)0x0) {
    iVar4 = gost_grasshopper_cipher_init
                      ((EVP_CIPHER_CTX *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                       (uchar *)0x0,iVar4);
  }
  else {
    uVar3 = EVP_MD_CTX_new();
    *(undefined8 *)(puVar2 + 0x1c8) = uVar3;
    if (*(long *)(puVar2 + 0x1c8) == 0) {
      ERR_GOST_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0
                    );
      iVar4 = 0;
    }
    else {
      iVar1 = gost2015_acpkm_omac_init
                        ((int)key,iv._4_4_,(uchar *)CONCAT44(enc,in_stack_00000030),(EVP_MD_CTX *)c,
                         in_stack_00000020,(uchar *)cipher_key._24_8_);
      if (iVar1 == 1) {
        iVar4 = gost_grasshopper_cipher_init
                          ((EVP_CIPHER_CTX *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           in_RSI,iVar4);
      }
      else {
        EVP_MD_CTX_free(*(undefined8 *)(puVar2 + 0x1c8));
        *(undefined8 *)(puVar2 + 0x1c8) = 0;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_ctracpkm_omac(EVP_CIPHER_CTX
                                           *ctx, const unsigned
                                           char *key, const unsigned
                                           char *iv, int enc)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

    /* NB: setting type makes EVP do_cipher callback useless */
    c->c.type = GRASSHOPPER_CIPHER_CTRACPKMOMAC;
    EVP_CIPHER_CTX_set_num(ctx, 0);
    c->section_size = 4096;

    if (key) {
        unsigned char cipher_key[32];
        c->omac_ctx = EVP_MD_CTX_new();

        if (c->omac_ctx == NULL) {
            GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_INIT_CTRACPKM_OMAC, ERR_R_MALLOC_FAILURE);
            return 0;
        }

        if (gost2015_acpkm_omac_init(NID_kuznyechik_mac, enc, key,
           c->omac_ctx, cipher_key, c->kdf_seed) != 1) {
            EVP_MD_CTX_free(c->omac_ctx);
            c->omac_ctx = NULL;
            return 0;
        }

        return gost_grasshopper_cipher_init(ctx, cipher_key, iv, enc);
    }

    return gost_grasshopper_cipher_init(ctx, key, iv, enc);
}